

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O2

Name wasm::getBinaryFuncName(Binary *curr)

{
  size_t sVar1;
  size_t *psVar2;
  char *pcVar3;
  Name NVar4;
  
  switch(curr->op) {
  case DivSInt32:
    psVar2 = &I32S_DIV;
    break;
  case DivUInt32:
    psVar2 = &I32U_DIV;
    break;
  case RemSInt32:
    psVar2 = &I32S_REM;
    break;
  case RemUInt32:
    psVar2 = &I32U_REM;
    break;
  default:
    switch(curr->op) {
    case DivSInt64:
      psVar2 = &I64S_DIV;
      break;
    case DivUInt64:
      psVar2 = &I64U_DIV;
      break;
    case RemSInt64:
      psVar2 = &I64S_REM;
      break;
    case RemUInt64:
      psVar2 = &I64U_REM;
      break;
    default:
      sVar1 = 0;
      pcVar3 = (char *)0x0;
      goto LAB_009705da;
    }
  }
  sVar1 = *psVar2;
  pcVar3 = (char *)psVar2[1];
LAB_009705da:
  NVar4.super_IString.str._M_str = pcVar3;
  NVar4.super_IString.str._M_len = sVar1;
  return (Name)NVar4.super_IString.str;
}

Assistant:

Name getBinaryFuncName(Binary* curr) {
  switch (curr->op) {
    case RemSInt32:
      return I32S_REM;
    case RemUInt32:
      return I32U_REM;
    case DivSInt32:
      return I32S_DIV;
    case DivUInt32:
      return I32U_DIV;
    case RemSInt64:
      return I64S_REM;
    case RemUInt64:
      return I64U_REM;
    case DivSInt64:
      return I64S_DIV;
    case DivUInt64:
      return I64U_DIV;
    default:
      return Name();
  }
}